

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text.c
# Opt level: O3

size_t dictionary_text_get_all_match_lengths
                 (dictionary_t t_dictionary,ucs4_t *word,size_t *match_length)

{
  size_t sVar1;
  void *pvVar2;
  ulong len;
  entry buff;
  long local_40 [2];
  
  if (*t_dictionary == 0) {
    sVar1 = 0;
  }
  else {
    sVar1 = ucs4len(word);
    len = *(ulong *)((long)t_dictionary + 8);
    if (sVar1 < *(ulong *)((long)t_dictionary + 8)) {
      len = sVar1;
    }
    ucs4ncpy(*(ucs4_t **)((long)t_dictionary + 0x18),word,len);
    local_40[0] = *(long *)((long)t_dictionary + 0x18);
    *(undefined4 *)(local_40[0] + len * 4) = 0;
    sVar1 = 0;
    if (len != 0) {
      do {
        *(undefined4 *)(*(long *)((long)t_dictionary + 0x18) + len * 4) = 0;
        pvVar2 = bsearch(local_40,*(void **)((long)t_dictionary + 0x10),*t_dictionary,0x10,
                         qsort_entry_cmp);
        if (pvVar2 != (void *)0x0) {
          match_length[sVar1] = len;
          sVar1 = sVar1 + 1;
        }
        len = len - 1;
      } while (len != 0);
    }
  }
  return sVar1;
}

Assistant:

size_t dictionary_text_get_all_match_lengths(dictionary_t t_dictionary, const ucs4_t * word,
		size_t * match_length)
{
	text_dictionary_desc * text_dictionary = (text_dictionary_desc *) t_dictionary;

	size_t rscnt = 0;

	if (text_dictionary->entry_count == 0)
		return rscnt;

	size_t length = ucs4len(word);
	size_t len = text_dictionary->max_length;
	if (length < len)
		len = length;

	ucs4ncpy(text_dictionary->word_buff, word, len);
	text_dictionary->word_buff[len] = L'\0';

	entry buff;
	buff.key = text_dictionary->word_buff;

	for (; len > 0; len --)
	{
		text_dictionary->word_buff[len] = L'\0';
		entry * brs = (entry *) bsearch(
				&buff,
				text_dictionary->lexicon,
				text_dictionary->entry_count,
				sizeof(text_dictionary->lexicon[0]),
				qsort_entry_cmp
		);

		if (brs != NULL)
			match_length[rscnt ++] = len;
	}

	return rscnt;
}